

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

QCborValueRef __thiscall QCborValue::operator[](QCborValue *this,QString *key)

{
  char16_t *pcVar1;
  QCborContainerPrivate *pQVar2;
  QCborContainerPrivate *pQVar3;
  storage_type_conflict *in_RCX;
  QStringView key_00;
  QCborValueConstRef QVar4;
  
  pcVar1 = (key->d).ptr;
  pQVar2 = (QCborContainerPrivate *)(key->d).size;
  if (*(int *)(this + 0x10) != 0xa0) {
    if (*(int *)(this + 0x10) == 0x80) {
      convertArrayToMap((QCborContainerPrivate **)(this + 8));
    }
    else {
      pQVar3 = *(QCborContainerPrivate **)(this + 8);
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      *(undefined4 *)(this + 0x10) = 0xa0;
      if (pQVar3 != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(pQVar3);
      }
    }
  }
  *(undefined4 *)(this + 0x10) = 0xa0;
  *(undefined8 *)this = 0xffffffffffffffff;
  key_00.m_data = in_RCX;
  key_00.m_size = (qsizetype)pcVar1;
  QVar4 = (QCborValueConstRef)
          QCborContainerPrivate::findOrAddMapKey<QStringView>
                    (*(QCborContainerPrivate **)(this + 8),pQVar2,key_00);
  pQVar3 = QVar4.d;
  pQVar2 = *(QCborContainerPrivate **)(this + 8);
  if (pQVar2 != pQVar3) {
    if (pQVar2 != (QCborContainerPrivate *)0x0) {
      QCborContainerPrivate::deref(pQVar2);
    }
    if (pQVar3 != (QCborContainerPrivate *)0x0) {
      LOCK();
      (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    *(QCborContainerPrivate **)(this + 8) = pQVar3;
  }
  return (QCborValueRef)QVar4;
}

Assistant:

QCborValueRef QCborValue::operator[](const QString &key)
{
    return QCborContainerPrivate::findOrAddMapKey(*this, qToStringViewIgnoringNull(key));
}